

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateBitSignal(Prs_Ntk_t *pNtk,int Sig)

{
  bool bVar1;
  bool bVar2;
  Prs_ManType_t PVar3;
  int iVar4;
  int iVar5;
  Prs_ManType_t PVar6;
  char *pcVar7;
  Vec_Int_t *p;
  char *local_50;
  char *pConst;
  int fOnly1;
  int fOnly0;
  Prs_ManType_t Type;
  int Value;
  int SigOne;
  int SigTemp;
  int i;
  Vec_Int_t *vSigs;
  int Sig_local;
  Prs_Ntk_t *pNtk_local;
  
  Type = ~CBA_PRS_NAME;
  iVar4 = Abc_Lit2Var2(Sig);
  iVar5 = Abc_Lit2Att2(Sig);
  if ((iVar5 == 0) || (iVar5 == 1)) {
    pNtk_local._4_4_ = -1;
  }
  else if (iVar5 == 2) {
    bVar1 = true;
    bVar2 = true;
    pcVar7 = Prs_NtkConst(pNtk,iVar4);
    pcVar7 = strchr(pcVar7,0x27);
    local_50 = pcVar7 + 1;
    if (pcVar7[1] != 'b') {
      __assert_fail("*pConst == \'b\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x679,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
    }
    while (pcVar7 = local_50 + 1, local_50[1] != '\0') {
      local_50 = pcVar7;
      if (*pcVar7 == '0') {
        bVar2 = false;
      }
      else if (*pcVar7 == '1') {
        bVar1 = false;
      }
    }
    if (bVar1) {
      pNtk_local._4_4_ = Abc_Var2Lit2(1,2);
    }
    else if (bVar2) {
      pNtk_local._4_4_ = Abc_Var2Lit2(2,2);
    }
    else {
      pNtk_local._4_4_ = -1;
    }
  }
  else {
    if (iVar5 != 3) {
      __assert_fail("Type == CBA_PRS_CONCAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x685,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
    }
    p = Prs_CatSignals(pNtk,iVar4);
    for (SigOne = 0; iVar4 = Vec_IntSize(p), SigOne < iVar4; SigOne = SigOne + 1) {
      iVar4 = Vec_IntEntry(p,SigOne);
      PVar6 = Abc_Lit2Var2(iVar4);
      iVar4 = Abc_Lit2Att2(iVar4);
      if (iVar4 != 0) {
        return -1;
      }
      PVar3 = PVar6;
      if ((Type != ~CBA_PRS_NAME) && (PVar3 = Type, Type != PVar6)) {
        return -1;
      }
      Type = PVar3;
    }
    if ((int)Type < 0) {
      __assert_fail("SigOne >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x692,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
    }
    pNtk_local._4_4_ = Abc_Var2Lit2(Type,0);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Prs_CreateBitSignal( Prs_Ntk_t * pNtk, int Sig )
{
    Vec_Int_t * vSigs;
    int i, SigTemp, SigOne = -1, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME || Type == CBA_PRS_SLICE )
        return -1;
    if ( Type == CBA_PRS_CONST )
    {
        int fOnly0 = 1, fOnly1 = 1;
        char * pConst = Prs_NtkConst(pNtk, Value);
        pConst = strchr( pConst, '\'' ) + 1;
        assert( *pConst == 'b' );
        while ( *++pConst )
            if ( *pConst == '0' )
                fOnly1 = 0;
            else if ( *pConst == '1' )
                fOnly0 = 0;
        if ( fOnly0 )
            return Abc_Var2Lit2( 1, CBA_PRS_CONST ); // const0
        if ( fOnly1 )
            return Abc_Var2Lit2( 2, CBA_PRS_CONST ); // const1
        return -1;
    }
    assert( Type == CBA_PRS_CONCAT );
    vSigs = Prs_CatSignals( pNtk, Value );
    Vec_IntForEachEntry( vSigs, SigTemp, i )
    {
        Value = Abc_Lit2Var2( SigTemp );
        Type = (Prs_ManType_t)Abc_Lit2Att2( SigTemp );
        if ( Type != CBA_PRS_NAME )
            return -1;
        if ( SigOne == -1 )
            SigOne = Value;
        else if ( SigOne != Value )
            return -1;
    }
    assert( SigOne >= 0 );
    return Abc_Var2Lit2( SigOne, CBA_PRS_NAME );
}